

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_optimizer.cpp
# Opt level: O0

uint _computeNumberBoolOperation<unsigned_int>(TokenType type,NumberToken *lhs,NumberToken *rhs)

{
  uint uVar1;
  uint uVar2;
  allocator<char> local_41;
  string local_40;
  NumberToken *local_20;
  NumberToken *rhs_local;
  NumberToken *lhs_local;
  TokenType type_local;
  
  local_20 = rhs;
  rhs_local = lhs;
  lhs_local._2_2_ = type;
  switch(type) {
  case TOK_OP_EQ:
    uVar1 = pfederc::NumberToken::getNumber<unsigned_int>(lhs);
    uVar2 = pfederc::NumberToken::getNumber<unsigned_int>(local_20);
    lhs_local._4_4_ = (uint)(uVar1 == uVar2);
    break;
  case TOK_OP_NQ:
    uVar1 = pfederc::NumberToken::getNumber<unsigned_int>(lhs);
    uVar2 = pfederc::NumberToken::getNumber<unsigned_int>(local_20);
    lhs_local._4_4_ = (uint)(uVar1 != uVar2);
    break;
  case TOK_OP_LT:
    uVar1 = pfederc::NumberToken::getNumber<unsigned_int>(lhs);
    uVar2 = pfederc::NumberToken::getNumber<unsigned_int>(local_20);
    lhs_local._4_4_ = (uint)(uVar1 < uVar2);
    break;
  case TOK_OP_LEQ:
    uVar1 = pfederc::NumberToken::getNumber<unsigned_int>(lhs);
    uVar2 = pfederc::NumberToken::getNumber<unsigned_int>(local_20);
    lhs_local._4_4_ = (uint)(uVar1 <= uVar2);
    break;
  case TOK_OP_GT:
    uVar1 = pfederc::NumberToken::getNumber<unsigned_int>(lhs);
    uVar2 = pfederc::NumberToken::getNumber<unsigned_int>(local_20);
    lhs_local._4_4_ = (uint)(uVar2 < uVar1);
    break;
  case TOK_OP_GEQ:
    uVar1 = pfederc::NumberToken::getNumber<unsigned_int>(lhs);
    uVar2 = pfederc::NumberToken::getNumber<unsigned_int>(local_20);
    lhs_local._4_4_ = (uint)(uVar2 <= uVar1);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Unknown operation",&local_41);
    pfederc::fatal("/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/syntax_optimizer.cpp"
                   ,0xb3,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    lhs_local._4_4_ = 0;
  }
  return lhs_local._4_4_;
}

Assistant:

static R _computeNumberBoolOperation(TokenType type, const NumberToken &lhs, const NumberToken &rhs) {
	switch (type) {
	case TokenType::TOK_OP_LT:
		return lhs.getNumber<R>() < rhs.getNumber<R>();
	case TokenType::TOK_OP_GT:
		return lhs.getNumber<R>() > rhs.getNumber<R>();
	case TokenType::TOK_OP_LEQ:
		return lhs.getNumber<R>() <= rhs.getNumber<R>();
	case TokenType::TOK_OP_GEQ:
		return lhs.getNumber<R>() >= rhs.getNumber<R>();
	case TokenType::TOK_OP_EQ:
		return lhs.getNumber<R>() == rhs.getNumber<R>();
	case TokenType::TOK_OP_NQ:
		return lhs.getNumber<R>() != rhs.getNumber<R>();
	default:
		fatal(__FILE__, __LINE__, "Unknown operation");
		return 0;
	}
}